

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O3

string * __thiscall
interval::str_abi_cxx11_(string *__return_storage_ptr__,interval *this,Interval i)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string s;
  string f;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  istr_abi_cxx11_(&local_38,(int)this);
  istr_abi_cxx11_(&local_78,(int)((ulong)this >> 0x20));
  std::operator+(&local_58,"[",&local_38);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string interval::str(Interval i) {
  std::string f = istr(lower(i));
  std::string s = istr(upper(i));
  return "[" + f + "," + s + "]";
}